

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O1

bool wasm::StackUtils::mayBeUnreachable(Expression *expr)

{
  Id IVar1;
  Id IVar2;
  
  IVar1 = expr->_id;
  IVar2 = BlockId;
  switch(IVar1) {
  case BlockId:
  case IfId:
  case LoopId:
  case SwitchId:
  case ReturnId:
    break;
  case BreakId:
    IVar2 = expr[2].type.id == 0;
    break;
  case CallId:
    IVar2 = expr[4]._id;
    break;
  case CallIndirectId:
    IVar2 = expr[5]._id;
    break;
  default:
    if ((IVar1 < 0x38) && ((0xf0000000800000U >> ((ulong)(uint)IVar1 & 0x3f) & 1) != 0)) {
      return true;
    }
  case LocalGetId:
  case LocalSetId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
    IVar2 = InvalidId;
  }
  return (bool)IVar2;
}

Assistant:

bool mayBeUnreachable(Expression* expr) {
  if (Properties::isControlFlowStructure(expr)) {
    return true;
  }
  switch (expr->_id) {
    case Expression::Id::BreakId:
      return expr->cast<Break>()->condition == nullptr;
    case Expression::Id::CallId:
      return expr->cast<Call>()->isReturn;
    case Expression::Id::CallIndirectId:
      return expr->cast<CallIndirect>()->isReturn;
    case Expression::Id::ReturnId:
    case Expression::Id::SwitchId:
    case Expression::Id::UnreachableId:
    case Expression::Id::ThrowId:
    case Expression::Id::RethrowId:
      return true;
    default:
      return false;
  }
}